

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

int kwsysProcessCreate(cmsysProcess *cp,int prIndex,kwsysProcessCreateInformation *si)

{
  int iVar1;
  __pid_t _Var2;
  __pid_t _Var3;
  ssize_t sVar4;
  int *piVar5;
  kwsysProcess_ssize_t total;
  ulong uVar6;
  int *piVar7;
  undefined4 uVar8;
  int pgidPipe [2];
  char tmp;
  sigset_t old_mask;
  sigset_t mask;
  int local_1e0;
  int local_1dc;
  int *local_1d8;
  int local_1cc;
  _union_1457 local_1c8 [19];
  sigset_t local_130;
  sigset_t local_b0;
  
  piVar7 = si->ErrorPipe;
  iVar1 = pipe(piVar7);
  if (iVar1 < 0) {
    return 0;
  }
  iVar1 = pipe(&local_1e0);
  if (iVar1 < 0) {
    kwsysProcessCleanupDescriptor(piVar7);
    piVar7 = si->ErrorPipe + 1;
  }
  else {
    piVar5 = si->ErrorPipe + 1;
    iVar1 = fcntl(si->ErrorPipe[1],2,1);
    if ((iVar1 < 0) || (iVar1 = fcntl(local_1dc,2,1), iVar1 < 0)) {
      kwsysProcessCleanupDescriptor(piVar7);
    }
    else {
      local_1d8 = piVar5;
      sigemptyset(&local_b0);
      sigaddset(&local_b0,2);
      sigaddset(&local_b0,0xf);
      iVar1 = sigprocmask(0,&local_b0,&local_130);
      if (-1 < iVar1) {
        iVar1 = cp->OptionDetach;
        _Var2 = fork();
        uVar8 = _Var2;
        if (-1 < _Var2 && iVar1 != 0) {
          if (_Var2 == 0) {
            local_1c8[0]._0_4_ = fork();
            if (local_1c8[0]._0_4_ != 0) goto LAB_003b0e87;
            uVar8 = 0;
          }
          else {
            do {
              sVar4 = read(*piVar7,local_1c8,4);
              if (-1 < sVar4) break;
              piVar5 = __errno_location();
            } while (*piVar5 == 4);
            do {
              _Var3 = waitpid(_Var2,&local_1cc,0);
              uVar8 = local_1c8[0]._0_4_;
              if (-1 < _Var3) break;
              piVar5 = __errno_location();
              uVar8 = local_1c8[0]._0_4_;
            } while (*piVar5 == 4);
          }
        }
        cp->ForkPIDs[prIndex] = uVar8;
        if (-1 < cp->ForkPIDs[prIndex]) {
          if (cp->ForkPIDs[prIndex] == 0) {
            close(si->ErrorPipe[0]);
            close(local_1e0);
            iVar1 = si->StdIn;
            if (iVar1 < 1) {
              if (iVar1 < 0) {
                close(0);
              }
            }
            else {
              dup2(iVar1,0);
            }
            if (si->StdOut != 1) {
              dup2(si->StdOut,1);
            }
            if (si->StdErr != 2) {
              dup2(si->StdErr,2);
            }
            fcntl(0,2,0);
            fcntl(1,2,0);
            fcntl(2,2,0);
            memset(local_1c8,0,0x98);
            sigaction(1,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(2,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(3,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(4,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(5,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(6,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(6,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(7,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(8,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(10,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0xb,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0xc,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0xd,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0xe,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0xf,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x10,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x11,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x11,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x12,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x14,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x15,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x16,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x17,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x18,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x19,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x1a,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x1b,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x1c,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x1d,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x1d,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x1e,(sigaction *)local_1c8,(sigaction *)0x0);
            sigaction(0x1f,(sigaction *)local_1c8,(sigaction *)0x0);
            sigprocmask(2,&local_130,(sigset_t *)0x0);
            if ((cp->CreateProcessGroup == 0) || (_Var2 = setsid(), -1 < _Var2)) {
              execvp(*cp->Commands[prIndex],cp->Commands[prIndex]);
            }
            kwsysProcessChildErrorExit(*local_1d8);
LAB_003b0e87:
            piVar7 = local_1d8;
            do {
              sVar4 = write(*piVar7,local_1c8,4);
              if (-1 < sVar4) break;
              piVar5 = __errno_location();
            } while (*piVar5 == 4);
            _exit(0);
          }
          kwsysProcessCleanupDescriptor(local_1d8);
          kwsysProcessCleanupDescriptor(&local_1dc);
          do {
            sVar4 = read(local_1e0,local_1c8,1);
          } while (0 < sVar4);
          if (sVar4 < 0) {
            sigprocmask(2,&local_130,(sigset_t *)0x0);
            kwsysProcessCleanupDescriptor(piVar7);
            piVar7 = &local_1e0;
          }
          else {
            kwsysProcessCleanupDescriptor(&local_1e0);
            iVar1 = sigprocmask(2,&local_130,(sigset_t *)0x0);
            if (-1 < iVar1) {
              cp->CommandsLeft = cp->CommandsLeft + 1;
              uVar6 = 0;
              do {
                while (sVar4 = read(*piVar7,cp->ErrorMessage + uVar6,0x400 - uVar6), sVar4 < 0) {
                  piVar5 = __errno_location();
                  if (*piVar5 != 4) goto LAB_003b0b36;
                }
                uVar6 = uVar6 + sVar4;
              } while ((uVar6 < 0x400) && (sVar4 != 0));
LAB_003b0b36:
              kwsysProcessCleanupDescriptor(piVar7);
              return (uint)(uVar6 == 0);
            }
          }
          goto LAB_003b0b82;
        }
        sigprocmask(2,&local_130,(sigset_t *)0x0);
      }
      kwsysProcessCleanupDescriptor(piVar7);
      piVar5 = local_1d8;
    }
    kwsysProcessCleanupDescriptor(piVar5);
    kwsysProcessCleanupDescriptor(&local_1e0);
    piVar7 = &local_1dc;
  }
LAB_003b0b82:
  kwsysProcessCleanupDescriptor(piVar7);
  return 0;
}

Assistant:

static int kwsysProcessCreate(kwsysProcess* cp, int prIndex,
                              kwsysProcessCreateInformation* si)
{
  sigset_t mask, old_mask;
  int pgidPipe[2];
  char tmp;
  ssize_t readRes;

  /* Create the error reporting pipe.  */
  if (pipe(si->ErrorPipe) < 0) {
    return 0;
  }

  /* Create a pipe for detecting that the child process has created a process
     group and session.  */
  if (pipe(pgidPipe) < 0) {
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);
    return 0;
  }

  /* Set close-on-exec flag on the pipe's write end.  */
  if (fcntl(si->ErrorPipe[1], F_SETFD, FD_CLOEXEC) < 0 ||
      fcntl(pgidPipe[1], F_SETFD, FD_CLOEXEC) < 0) {
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);
    kwsysProcessCleanupDescriptor(&pgidPipe[0]);
    kwsysProcessCleanupDescriptor(&pgidPipe[1]);
    return 0;
  }

  /* Block SIGINT / SIGTERM while we start.  The purpose is so that our signal
     handler doesn't get called from the child process after the fork and
     before the exec, and subsequently start kill()'ing PIDs from ForkPIDs. */
  sigemptyset(&mask);
  sigaddset(&mask, SIGINT);
  sigaddset(&mask, SIGTERM);
  if (sigprocmask(SIG_BLOCK, &mask, &old_mask) < 0) {
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);
    kwsysProcessCleanupDescriptor(&pgidPipe[0]);
    kwsysProcessCleanupDescriptor(&pgidPipe[1]);
    return 0;
  }

/* Fork off a child process.  */
#if defined(__VMS)
  /* VMS needs vfork and execvp to be in the same function because
     they use setjmp/longjmp to run the child startup code in the
     parent!  TODO: OptionDetach.  Also
     TODO:  CreateProcessGroup.  */
  cp->ForkPIDs[prIndex] = vfork();
#else
  cp->ForkPIDs[prIndex] = kwsysProcessFork(cp, si);
#endif
  if (cp->ForkPIDs[prIndex] < 0) {
    sigprocmask(SIG_SETMASK, &old_mask, 0);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);
    kwsysProcessCleanupDescriptor(&pgidPipe[0]);
    kwsysProcessCleanupDescriptor(&pgidPipe[1]);
    return 0;
  }

  if (cp->ForkPIDs[prIndex] == 0) {
#if defined(__VMS)
    /* Specify standard pipes for child process.  */
    decc$set_child_standard_streams(si->StdIn, si->StdOut, si->StdErr);
#else
    /* Close the read end of the error reporting / process group
       setup pipe.  */
    close(si->ErrorPipe[0]);
    close(pgidPipe[0]);

    /* Setup the stdin, stdout, and stderr pipes.  */
    if (si->StdIn > 0) {
      dup2(si->StdIn, 0);
    } else if (si->StdIn < 0) {
      close(0);
    }
    if (si->StdOut != 1) {
      dup2(si->StdOut, 1);
    }
    if (si->StdErr != 2) {
      dup2(si->StdErr, 2);
    }

    /* Clear the close-on-exec flag for stdin, stdout, and stderr.
       All other pipe handles will be closed when exec succeeds.  */
    fcntl(0, F_SETFD, 0);
    fcntl(1, F_SETFD, 0);
    fcntl(2, F_SETFD, 0);

    /* Restore all default signal handlers. */
    kwsysProcessRestoreDefaultSignalHandlers();

    /* Now that we have restored default signal handling and created the
       process group, restore mask.  */
    sigprocmask(SIG_SETMASK, &old_mask, 0);

    /* Create new process group.  We use setsid instead of setpgid to avoid
       the child getting hung up on signals like SIGTTOU.  (In the real world,
       this has been observed where "git svn" ends up calling the "resize"
       program which opens /dev/tty.  */
    if (cp->CreateProcessGroup && setsid() < 0) {
      kwsysProcessChildErrorExit(si->ErrorPipe[1]);
    }
#endif

    /* Execute the real process.  If successful, this does not return.  */
    execvp(cp->Commands[prIndex][0], cp->Commands[prIndex]);
    /* TODO: What does VMS do if the child fails to start?  */
    /* TODO: On VMS, how do we put the process in a new group?  */

    /* Failure.  Report error to parent and terminate.  */
    kwsysProcessChildErrorExit(si->ErrorPipe[1]);
  }

#if defined(__VMS)
  /* Restore the standard pipes of this process.  */
  decc$set_child_standard_streams(0, 1, 2);
#endif

  /* We are done with the error reporting pipe and process group setup pipe
     write end.  */
  kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);
  kwsysProcessCleanupDescriptor(&pgidPipe[1]);

  /* Make sure the child is in the process group before we proceed.  This
     avoids race conditions with calls to the kill function that we make for
     signalling process groups.  */
  while ((readRes = read(pgidPipe[0], &tmp, 1)) > 0)
    ;
  if (readRes < 0) {
    sigprocmask(SIG_SETMASK, &old_mask, 0);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    kwsysProcessCleanupDescriptor(&pgidPipe[0]);
    return 0;
  }
  kwsysProcessCleanupDescriptor(&pgidPipe[0]);

  /* Unmask signals.  */
  if (sigprocmask(SIG_SETMASK, &old_mask, 0) < 0) {
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    return 0;
  }

  /* A child has been created.  */
  ++cp->CommandsLeft;

  /* Block until the child's exec call succeeds and closes the error
     pipe or writes data to the pipe to report an error.  */
  {
    kwsysProcess_ssize_t total = 0;
    kwsysProcess_ssize_t n = 1;
    /* Read the entire error message up to the length of our buffer.  */
    while (total < KWSYSPE_PIPE_BUFFER_SIZE && n > 0) {
      /* Keep trying to read until the operation is not interrupted.  */
      while (((n = read(si->ErrorPipe[0], cp->ErrorMessage + total,
                        (size_t)(KWSYSPE_PIPE_BUFFER_SIZE - total))) < 0) &&
             (errno == EINTR))
        ;
      if (n > 0) {
        total += n;
      }
    }

    /* We are done with the error reporting pipe read end.  */
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);

    if (total > 0) {
      /* The child failed to execute the process.  */
      return 0;
    }
  }

  return 1;
}